

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessing.cc
# Opt level: O2

void bidirectional::detectNegativeCostCycle(DiGraph *graph_ptr)

{
  LemonPath path;
  BellmanFord<lemon::SmartDigraph,_lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<double>,_lemon::BellmanFordDefaultTraits<lemon::SmartDigraph,_lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<double>_>_>
  local_88;
  Path<lemon::SmartDigraph> local_38;
  
  local_88._gr = (graph_ptr->lemon_graph_ptr)._M_t.
                 super___uniq_ptr_impl<lemon::SmartDigraph,_std::default_delete<lemon::SmartDigraph>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_lemon::SmartDigraph_*,_std::default_delete<lemon::SmartDigraph>_>
                 .super__Head_base<0UL,_lemon::SmartDigraph_*,_false>._M_head_impl;
  local_88._length =
       (graph_ptr->weight_map_ptr)._M_t.
       super___uniq_ptr_impl<lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<double>,_std::default_delete<lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<double>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<double>_*,_std::default_delete<lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<double>_>_>
       .
       super__Head_base<0UL,_lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<double>_*,_false>
       ._M_head_impl;
  local_88._pred = (PredMap *)0x0;
  local_88._local_pred = false;
  local_88._dist = (DistMap *)0x0;
  local_88._local_dist = false;
  local_88._mask = (MaskMap *)0x0;
  local_88._process.
  super__Vector_base<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88._process.
  super__Vector_base<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88._process.
  super__Vector_base<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lemon::
  BellmanFord<lemon::SmartDigraph,_lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<double>,_lemon::BellmanFordDefaultTraits<lemon::SmartDigraph,_lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<double>_>_>
  ::run(&local_88,(Node)(graph_ptr->source).lemon_id,graph_ptr->number_edges);
  lemon::
  BellmanFord<lemon::SmartDigraph,_lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<double>,_lemon::BellmanFordDefaultTraits<lemon::SmartDigraph,_lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<double>_>_>
  ::negativeCycle(&local_38,&local_88);
  graph_ptr->negative_cost_cycle_present =
       (uint)(local_38.tail.
              super__Vector_base<lemon::SmartDigraphBase::Arc,_std::allocator<lemon::SmartDigraphBase::Arc>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              local_38.tail.
              super__Vector_base<lemon::SmartDigraphBase::Arc,_std::allocator<lemon::SmartDigraphBase::Arc>_>
              ._M_impl.super__Vector_impl_data._M_start &&
             local_38.head.
             super__Vector_base<lemon::SmartDigraphBase::Arc,_std::allocator<lemon::SmartDigraphBase::Arc>_>
             ._M_impl.super__Vector_impl_data._M_start ==
             local_38.head.
             super__Vector_base<lemon::SmartDigraphBase::Arc,_std::allocator<lemon::SmartDigraphBase::Arc>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  lemon::Path<lemon::SmartDigraph>::~Path(&local_38);
  lemon::
  BellmanFord<lemon::SmartDigraph,_lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<double>,_lemon::BellmanFordDefaultTraits<lemon::SmartDigraph,_lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<double>_>_>
  ::~BellmanFord(&local_88);
  return;
}

Assistant:

void detectNegativeCostCycle(DiGraph* graph_ptr) {
  const LemonNode& source =
      graph_ptr->getLNodeFromId(graph_ptr->source.lemon_id);
  lemon::BellmanFord<LemonGraph, LemonGraph::ArcMap<double>> BF(
      *graph_ptr->lemon_graph_ptr, *graph_ptr->weight_map_ptr);
  BF.run(source, graph_ptr->number_edges);
  LemonPath path = BF.negativeCycle();

  // Update negative_cost_cycle_present member
  if (path.empty())
    graph_ptr->negative_cost_cycle_present = FALSE;
  else
    graph_ptr->negative_cost_cycle_present = TRUE;
}